

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

int __thiscall cmGraphVizWriter::CollectAllTargets(cmGraphVizWriter *this)

{
  _Hash_node_base _Var1;
  bool bVar2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar3;
  ostream *this_00;
  mapped_type *this_01;
  mapped_type *ppcVar4;
  __node_base *p_Var5;
  ostringstream ostr;
  int local_210;
  allocator local_209;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>_>
  *local_208;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_200;
  string *local_1f8;
  pointer local_1f0;
  key_type local_1e8;
  key_type local_1c8;
  string local_1a8 [11];
  
  pvVar3 = this->LocalGenerators;
  local_1f0 = (pvVar3->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
  local_1f8 = (string *)&this->GraphNodePrefix;
  local_200 = &this->TargetNamesNodes;
  local_208 = &this->TargetPtrs;
  local_210 = 0;
  for (; local_1f0 !=
         (pvVar3->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
         _M_impl.super__Vector_impl_data._M_finish; local_1f0 = local_1f0 + 1) {
    p_Var5 = &((*local_1f0)->Makefile->Targets)._M_h._M_before_begin;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      _Var1._M_nxt = p_Var5[1]._M_nxt;
      std::__cxx11::string::string((string *)local_1a8,(char *)_Var1._M_nxt,(allocator *)&local_1e8)
      ;
      bVar2 = IgnoreThisTarget(this,local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        this_00 = std::operator<<((ostream *)local_1a8,local_1f8);
        std::ostream::operator<<(this_00,local_210);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string((string *)&local_1c8,(char *)_Var1._M_nxt,&local_209);
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](local_200,&local_1c8);
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::string
                  ((string *)&local_1e8,(char *)_Var1._M_nxt,(allocator *)&local_1c8);
        ppcVar4 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>_>
                  ::operator[](local_208,&local_1e8);
        local_210 = local_210 + 1;
        *ppcVar4 = (mapped_type)(p_Var5 + 5);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      }
    }
    pvVar3 = this->LocalGenerators;
  }
  return local_210;
}

Assistant:

int cmGraphVizWriter::CollectAllTargets()
{
  int cnt = 0;
  // First pass get the list of all cmake targets
  for (std::vector<cmLocalGenerator*>::const_iterator lit =
                                                 this->LocalGenerators.begin();
       lit != this->LocalGenerators.end();
       ++ lit )
    {
    const cmTargets* targets = &((*lit)->GetMakefile()->GetTargets());
    for ( cmTargets::const_iterator tit = targets->begin();
          tit != targets->end();
          ++ tit )
      {
      const char* realTargetName = tit->first.c_str();
      if(this->IgnoreThisTarget(realTargetName))
        {
        // Skip ignored targets
        continue;
        }
      //std::cout << "Found target: " << tit->first.c_str() << std::endl;
      std::ostringstream ostr;
      ostr << this->GraphNodePrefix << cnt++;
      this->TargetNamesNodes[realTargetName] = ostr.str();
      this->TargetPtrs[realTargetName] = &tit->second;
      }
    }

  return cnt;
}